

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O1

void __thiscall CVmObjFile::write_data_mode(CVmObjFile *this,vm_val_t *val)

{
  uint uVar1;
  CVmDataSource *fp;
  uint16_t tmp;
  int iVar2;
  ushort *puVar3;
  ulong uVar5;
  CVmObjPageEntry *pCVar6;
  char buf [32];
  vm_val_t new_str;
  undefined1 local_58 [32];
  undefined1 local_38 [16];
  _func_int **pp_Var4;
  
  puVar3 = (ushort *)local_58;
  fp = *(CVmDataSource **)((this->super_CVmObject).ext_ + 8);
  switch(val->typ) {
  case VM_TRUE:
    local_58[0] = 8;
    pp_Var4 = fp->_vptr_CVmDataSource;
    uVar5 = 1;
    break;
  case VM_STACK:
  case VM_CODEPTR:
  case VM_PROP:
switchD_00285ff0_caseD_3:
    err_throw(0x900);
  case VM_OBJ:
    iVar2 = (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc]
                                   [(val->val).obj & 0xfff].ptr_ + 8))
                      (G_obj_table_X.pages_[(val->val).obj >> 0xc] + ((val->val).obj & 0xfff),
                       CVmObjBigNum::metaclass_reg_);
    uVar1 = (val->val).obj;
    pCVar6 = G_obj_table_X.pages_[uVar1 >> 0xc];
    if (iVar2 == 0) {
      pCVar6 = pCVar6 + (uVar1 & 0xfff);
      iVar2 = (**(code **)(*(long *)&pCVar6->ptr_ + 8))(pCVar6,CVmObjByteArray::metaclass_reg_);
      uVar1 = (val->val).obj;
      pCVar6 = G_obj_table_X.pages_[uVar1 >> 0xc];
      if (iVar2 == 0) {
        pCVar6 = pCVar6 + (uVar1 & 0xfff);
        puVar3 = (ushort *)(**(code **)(*(long *)&pCVar6->ptr_ + 0x160))(pCVar6,uVar1,local_38);
        goto LAB_0028601b;
      }
      local_58[0] = 0x22;
      iVar2 = (*fp->_vptr_CVmDataSource[4])(fp,local_58,1);
      if (iVar2 != 0) goto LAB_00286087;
      iVar2 = CVmObjByteArray::write_to_data_file((CVmObjByteArray *)(pCVar6 + (uVar1 & 0xfff)),fp);
    }
    else {
      local_58[0] = 0x21;
      iVar2 = (*fp->_vptr_CVmDataSource[4])(fp,local_58,1);
      if (iVar2 != 0) goto LAB_00286087;
      iVar2 = CVmObjBigNum::write_to_data_file((CVmObjBigNum *)(pCVar6 + (uVar1 & 0xfff)),fp);
    }
    goto LAB_00286083;
  case VM_INT:
    local_58[0] = 1;
    goto LAB_0028606e;
  case VM_SSTRING:
    puVar3 = (ushort *)vm_val_t::get_as_string(val);
LAB_0028601b:
    local_58[0] = 3;
    iVar2 = (*fp->_vptr_CVmDataSource[4])(fp,local_58,1);
    if (iVar2 != 0) goto LAB_00286087;
    local_58[0] = (undefined1)(*puVar3 + 2);
    local_58[1] = (undefined1)((ushort)(*puVar3 + 2) >> 8);
    iVar2 = (*fp->_vptr_CVmDataSource[4])(fp,local_58,2);
    if (iVar2 != 0) goto LAB_00286087;
    uVar5 = (ulong)*puVar3;
    pp_Var4 = fp->_vptr_CVmDataSource;
    puVar3 = puVar3 + 1;
    break;
  default:
    if (val->typ != VM_ENUM) goto switchD_00285ff0_caseD_3;
    local_58[0] = 0x20;
LAB_0028606e:
    local_58._1_4_ = (val->val).obj;
    pp_Var4 = fp->_vptr_CVmDataSource;
    uVar5 = 5;
    puVar3 = (ushort *)local_58;
  }
  iVar2 = (*pp_Var4[4])(fp,puVar3,uVar5);
LAB_00286083:
  if (iVar2 == 0) {
    return;
  }
LAB_00286087:
  CVmRun::throw_new_class(&G_interpreter_X,G_predef_X.file_io_exc,0,"file I/O error");
}

Assistant:

void CVmObjFile::write_data_mode(VMG_ const vm_val_t *val)
{
    char buf[32];
    CVmDataSource *fp = get_ext()->fp;
    vm_val_t new_str;
    const char *constp;

    /* see what type of data we want to put */
    switch(val->typ)
    {
    case VM_INT:
        /* put the type in the buffer */
        buf[0] = VMOBJFILE_TAG_INT;
        
        /* add the value in INT4 format */
        oswp4s(buf + 1, val->val.intval);
        
        /* write out the type prefix plus the value */
        if (fp->write(buf, 5))
            goto io_error;

        /* done */
        break;

    case VM_ENUM:
        /* put the type in the buffer */
        buf[0] = VMOBJFILE_TAG_ENUM;

        /* add the value in INT4 format */
        oswp4(buf + 1, val->val.enumval);

        /* write out the type prefix plus the value */
        if (fp->write(buf, 5))
            goto io_error;

        /* done */
        break;

    case VM_SSTRING:
        /* get the string value pointer */
        constp = val->get_as_string(vmg0_);

    write_binary_string:
        /* write the type prefix byte */
        buf[0] = VMOBJFILE_TAG_STRING;
        if (fp->write(buf, 1))
            goto io_error;

        /* 
         *   write the length prefix - for TADS 2 compatibility, include
         *   the bytes of the prefix itself in the length count 
         */
        oswp2(buf, vmb_get_len(constp) + 2);
        if (fp->write(buf, 2))
            goto io_error;

        /* write the string's bytes */
        if (fp->write(constp + VMB_LEN, vmb_get_len(constp)))
            goto io_error;

        /* done */
        break;

    case VM_OBJ:
        /*
         *   Write BigNumber and ByteArray types in special formats.  For
         *   other types, try converting to a string. 
         */
        if (CVmObjBigNum::is_bignum_obj(vmg_ val->val.obj))
        {
            CVmObjBigNum *bignum;
            
            /* we know it's a BigNumber - cast it properly */
            bignum = (CVmObjBigNum *)vm_objp(vmg_ val->val.obj);

            /* write the type tag */
            buf[0] = VMOBJFILE_TAG_BIGNUM;
            if (fp->write(buf, 1))
                goto io_error;

            /* write it out */
            if (bignum->write_to_data_file(fp))
                goto io_error;
        }
        else if (CVmObjByteArray::is_byte_array(vmg_ val->val.obj))
        {
            CVmObjByteArray *bytarr;

            /* we know it's a ByteArray - cast it properly */
            bytarr = (CVmObjByteArray *)vm_objp(vmg_ val->val.obj);

            /* write the type tag */
            buf[0] = VMOBJFILE_TAG_BYTEARRAY;
            if (fp->write(buf, 1))
                goto io_error;
            
            /* write the array */
            if (bytarr->write_to_data_file(fp))
                goto io_error;
        }
        else
        {
            /* 
             *   Cast it to a string value and write that out.  Note that
             *   we can ignore garbage collection for any new string we've
             *   created, since we're just calling the OS-level file
             *   writer, which will never invoke garbage collection.  
             */
            constp = vm_objp(vmg_ val->val.obj)
                     ->cast_to_string(vmg_ val->val.obj, &new_str);
            goto write_binary_string;
        }